

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::setPose(btSoftBody *this,bool bvolume,bool bframe)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  btVector3 *ptr;
  Node *pNVar7;
  btMatrix3x3 *pbVar8;
  float *pfVar9;
  btVector3 *pbVar10;
  long lVar11;
  btScalar *pbVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  btScalar bVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  btScalar bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  btScalar bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  btVector3 bVar34;
  
  (this->m_pose).m_bvolume = bvolume;
  (this->m_pose).m_bframe = bframe;
  lVar11 = (long)(this->m_nodes).m_size;
  if (lVar11 < 1) {
    fVar21 = 0.0;
  }
  else {
    fVar21 = 0.0;
    lVar13 = 0;
    do {
      fVar24 = *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + lVar13);
      fVar21 = fVar21 + (float)(-(uint)(0.0 < fVar24) & (uint)(1.0 / fVar24));
      lVar13 = lVar13 + 0x78;
    } while (lVar11 * 0x78 - lVar13 != 0);
  }
  iVar4 = (this->m_nodes).m_size;
  iVar5 = (this->m_pose).m_wgh.m_size;
  if ((iVar5 <= iVar4) && (iVar5 < iVar4)) {
    if ((this->m_pose).m_wgh.m_capacity < iVar4) {
      if (iVar4 == 0) {
        pfVar9 = (float *)0x0;
      }
      else {
        pfVar9 = (float *)btAlignedAllocInternal((long)iVar4 * 4,0x10);
      }
      lVar11 = (long)(this->m_pose).m_wgh.m_size;
      if (0 < lVar11) {
        pfVar6 = (this->m_pose).m_wgh.m_data;
        lVar13 = 0;
        do {
          pfVar9[lVar13] = pfVar6[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar11 != lVar13);
      }
      pfVar6 = (this->m_pose).m_wgh.m_data;
      if (pfVar6 != (float *)0x0) {
        if ((this->m_pose).m_wgh.m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar6);
        }
        (this->m_pose).m_wgh.m_data = (float *)0x0;
      }
      (this->m_pose).m_wgh.m_ownsMemory = true;
      (this->m_pose).m_wgh.m_data = pfVar9;
      (this->m_pose).m_wgh.m_capacity = iVar4;
    }
    if (iVar5 < iVar4) {
      memset((this->m_pose).m_wgh.m_data + iVar5,0,((long)iVar4 - (long)iVar5) * 4);
    }
  }
  fVar24 = (float)iVar4 * fVar21 * 1000.0;
  (this->m_pose).m_wgh.m_size = iVar4;
  iVar4 = (this->m_nodes).m_size;
  lVar11 = (long)iVar4;
  if (0 < lVar11) {
    lVar13 = 0;
    do {
      uVar15 = -(uint)(0.0 < *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + lVar13));
      fVar21 = (float)(uVar15 & (uint)fVar21 | ~uVar15 & (uint)(fVar24 + fVar21));
      lVar13 = lVar13 + 0x78;
    } while (lVar11 * 0x78 - lVar13 != 0);
  }
  if (0 < iVar4) {
    pfVar9 = (this->m_pose).m_wgh.m_data;
    pbVar12 = &((this->m_nodes).m_data)->m_im;
    lVar13 = 0;
    do {
      uVar15 = -(uint)(0.0 < *pbVar12);
      pfVar9[lVar13] =
           (float)(~uVar15 & (uint)(fVar24 / fVar21) | (uint)(1.0 / (fVar21 * *pbVar12)) & uVar15);
      lVar13 = lVar13 + 1;
      pbVar12 = pbVar12 + 0x1e;
    } while (lVar11 != lVar13);
  }
  bVar34 = evaluateCom(this);
  if (((this->m_pose).m_pos.m_size < iVar4) && ((this->m_pose).m_pos.m_capacity < iVar4)) {
    if (iVar4 == 0) {
      pbVar10 = (btVector3 *)0x0;
    }
    else {
      pbVar10 = (btVector3 *)btAlignedAllocInternal(lVar11 << 4,0x10);
    }
    lVar11 = (long)(this->m_pose).m_pos.m_size;
    if (0 < lVar11) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_pose).m_pos.m_data)->m_floats + lVar13);
        uVar19 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar10->m_floats + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar19;
        lVar13 = lVar13 + 0x10;
      } while (lVar11 * 0x10 != lVar13);
    }
    ptr = (this->m_pose).m_pos.m_data;
    if (ptr != (btVector3 *)0x0) {
      if ((this->m_pose).m_pos.m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_pose).m_pos.m_data = (btVector3 *)0x0;
    }
    (this->m_pose).m_pos.m_ownsMemory = true;
    (this->m_pose).m_pos.m_data = pbVar10;
    (this->m_pose).m_pos.m_capacity = iVar4;
  }
  (this->m_pose).m_pos.m_size = iVar4;
  lVar11 = (long)(this->m_nodes).m_size;
  if (0 < lVar11) {
    lVar13 = 0x18;
    lVar14 = 0;
    do {
      pNVar7 = (this->m_nodes).m_data;
      uVar19 = *(undefined8 *)((long)(pNVar7->m_x).m_floats + lVar13 + -0x18);
      auVar18._0_4_ = (float)uVar19 - bVar34.m_floats[0];
      auVar18._4_4_ = (float)((ulong)uVar19 >> 0x20) - bVar34.m_floats[1];
      auVar18._8_4_ =
           *(float *)((long)&(((Node *)(&pNVar7->m_x + -1))->super_Feature).super_Element.m_tag +
                     lVar13) - bVar34.m_floats[2];
      auVar18._12_4_ = 0;
      *(undefined1 (*) [16])((long)((this->m_pose).m_pos.m_data)->m_floats + lVar14) = auVar18;
      lVar14 = lVar14 + 0x10;
      lVar13 = lVar13 + 0x78;
    } while (lVar11 * 0x10 != lVar14);
  }
  bVar16 = 0.0;
  if (bvolume) {
    bVar16 = getVolume(this);
  }
  (this->m_pose).m_volume = bVar16;
  *(long *)(this->m_pose).m_com.m_floats = bVar34.m_floats._0_8_;
  *(long *)((this->m_pose).m_com.m_floats + 2) = bVar34.m_floats._8_8_;
  (this->m_pose).m_rot.m_el[0].m_floats[0] = 1.0;
  pbVar8 = &(this->m_pose).m_rot;
  pbVar8->m_el[0].m_floats[1] = 0.0;
  pbVar8->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_rot.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_rot.m_el[1].m_floats[1] = 1.0;
  pbVar10 = (this->m_pose).m_rot.m_el;
  pbVar10[1].m_floats[2] = 0.0;
  pbVar10[1].m_floats[3] = 0.0;
  pbVar8 = &(this->m_pose).m_rot;
  pbVar8->m_el[2].m_floats[0] = 0.0;
  pbVar8->m_el[2].m_floats[1] = 0.0;
  pbVar10 = (this->m_pose).m_rot.m_el;
  pbVar10[2].m_floats[2] = 1.0;
  pbVar10[2].m_floats[3] = 0.0;
  (this->m_pose).m_scl.m_el[0].m_floats[0] = 1.0;
  pbVar8 = &(this->m_pose).m_scl;
  pbVar8->m_el[0].m_floats[1] = 0.0;
  pbVar8->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_scl.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_scl.m_el[1].m_floats[1] = 1.0;
  pbVar10 = (this->m_pose).m_scl.m_el;
  pbVar10[1].m_floats[2] = 0.0;
  pbVar10[1].m_floats[3] = 0.0;
  pbVar8 = &(this->m_pose).m_scl;
  pbVar8->m_el[2].m_floats[0] = 0.0;
  pbVar8->m_el[2].m_floats[1] = 0.0;
  (this->m_pose).m_scl.m_el[2].m_floats[2] = 1.0;
  *(undefined8 *)((this->m_pose).m_scl.m_el[2].m_floats + 3) = 0;
  pbVar8 = &(this->m_pose).m_aqq;
  pbVar8->m_el[0].m_floats[1] = 0.0;
  pbVar8->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[0].m_floats + 3) = 0;
  pbVar10 = (this->m_pose).m_aqq.m_el;
  pbVar10[1].m_floats[1] = 0.0;
  pbVar10[1].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[1].m_floats + 3) = 0;
  pbVar10 = (this->m_pose).m_aqq.m_el;
  pbVar10[2].m_floats[1] = 0.0;
  pbVar10[2].m_floats[2] = 0.0;
  (this->m_pose).m_aqq.m_el[2].m_floats[3] = 0.0;
  lVar11 = (long)(this->m_nodes).m_size;
  if (0 < lVar11) {
    bVar16 = (this->m_pose).m_aqq.m_el[2].m_floats[2];
    uVar19 = *(undefined8 *)(this->m_pose).m_aqq.m_el[2].m_floats;
    fVar21 = (float)uVar19;
    fVar24 = (float)((ulong)uVar19 >> 0x20);
    pbVar10 = (this->m_pose).m_pos.m_data;
    pfVar9 = (this->m_pose).m_wgh.m_data;
    uVar19 = *(undefined8 *)(this->m_pose).m_aqq.m_el[0].m_floats;
    bVar20 = (this->m_pose).m_aqq.m_el[0].m_floats[2];
    uVar3 = *(undefined8 *)(this->m_pose).m_aqq.m_el[1].m_floats;
    fVar22 = (float)uVar3;
    fVar23 = (float)((ulong)uVar3 >> 0x20);
    bVar25 = (this->m_pose).m_aqq.m_el[1].m_floats[2];
    lVar13 = 0;
    do {
      fVar26 = *(float *)((long)pfVar9 + lVar13);
      fVar27 = (float)*(undefined8 *)(pbVar10->m_floats + lVar13);
      fVar17 = (float)((ulong)*(undefined8 *)(pbVar10->m_floats + lVar13) >> 0x20);
      fVar31 = fVar27 * fVar26;
      fVar28 = fVar17 * fVar26;
      fVar26 = fVar26 * pbVar10->m_floats[lVar13 + 2];
      uVar19 = CONCAT44((float)((ulong)uVar19 >> 0x20) + fVar31 * fVar17,
                        (float)uVar19 + fVar31 * fVar27);
      bVar20 = bVar20 + fVar31 * pbVar10->m_floats[lVar13 + 2];
      *(undefined8 *)(this->m_pose).m_aqq.m_el[0].m_floats = uVar19;
      (this->m_pose).m_aqq.m_el[0].m_floats[2] = bVar20;
      bVar25 = bVar25 + pbVar10->m_floats[lVar13 + 2] * fVar28;
      fVar22 = fVar22 + fVar28 * (float)*(undefined8 *)(pbVar10->m_floats + lVar13);
      fVar23 = fVar23 + fVar28 * (float)((ulong)*(undefined8 *)(pbVar10->m_floats + lVar13) >> 0x20)
      ;
      *(ulong *)(this->m_pose).m_aqq.m_el[1].m_floats = CONCAT44(fVar23,fVar22);
      (this->m_pose).m_aqq.m_el[1].m_floats[2] = bVar25;
      bVar16 = bVar16 + pbVar10->m_floats[lVar13 + 2] * fVar26;
      fVar21 = fVar21 + fVar26 * (float)*(undefined8 *)(pbVar10->m_floats + lVar13);
      fVar24 = fVar24 + fVar26 * (float)((ulong)*(undefined8 *)(pbVar10->m_floats + lVar13) >> 0x20)
      ;
      *(ulong *)(this->m_pose).m_aqq.m_el[2].m_floats = CONCAT44(fVar24,fVar21);
      (this->m_pose).m_aqq.m_el[2].m_floats[2] = bVar16;
      lVar13 = lVar13 + 4;
    } while (lVar11 * 4 != lVar13);
  }
  fVar21 = (this->m_pose).m_aqq.m_el[1].m_floats[1];
  fVar24 = (this->m_pose).m_aqq.m_el[1].m_floats[2];
  fVar22 = (this->m_pose).m_aqq.m_el[1].m_floats[0];
  fVar23 = (this->m_pose).m_aqq.m_el[0].m_floats[0];
  fVar26 = (this->m_pose).m_aqq.m_el[0].m_floats[1];
  fVar27 = (this->m_pose).m_aqq.m_el[0].m_floats[2];
  uVar19 = *(undefined8 *)((this->m_pose).m_aqq.m_el[2].m_floats + 1);
  fVar29 = (float)uVar19;
  fVar30 = (float)((ulong)uVar19 >> 0x20);
  (this->m_pose).m_aqq.m_el[0].m_floats[3] = 0.0;
  fVar28 = (this->m_pose).m_aqq.m_el[2].m_floats[0];
  fVar31 = fVar21 * fVar30 - fVar24 * fVar29;
  fVar32 = fVar28 * fVar24 - fVar30 * fVar22;
  (this->m_pose).m_aqq.m_el[1].m_floats[3] = 0.0;
  uVar19 = *(undefined8 *)(this->m_pose).m_aqq.m_el[2].m_floats;
  fVar33 = fVar29 * fVar22 - (float)uVar19 * fVar21;
  fVar17 = 1.0 / (fVar27 * fVar33 + fVar23 * fVar31 + fVar26 * fVar32);
  *(ulong *)(this->m_pose).m_aqq.m_el[0].m_floats =
       CONCAT44((fVar27 * fVar29 - fVar26 * fVar30) * fVar17,fVar31 * fVar17);
  (this->m_pose).m_aqq.m_el[0].m_floats[2] = (fVar26 * fVar24 + -fVar27 * fVar21) * fVar17;
  *(ulong *)(this->m_pose).m_aqq.m_el[1].m_floats =
       CONCAT44((fVar30 * fVar23 - fVar28 * fVar27) * fVar17,fVar32 * fVar17);
  (this->m_pose).m_aqq.m_el[1].m_floats[2] = (fVar27 * fVar22 + -fVar23 * fVar24) * fVar17;
  *(ulong *)(this->m_pose).m_aqq.m_el[2].m_floats =
       CONCAT44(fVar17 * (fVar28 * fVar26 - (float)((ulong)uVar19 >> 0x20) * fVar23),fVar17 * fVar33
               );
  (this->m_pose).m_aqq.m_el[2].m_floats[2] = fVar17 * (fVar23 * fVar21 + -fVar26 * fVar22);
  (this->m_pose).m_aqq.m_el[2].m_floats[3] = 0.0;
  updateConstants(this);
  return;
}

Assistant:

void			btSoftBody::setPose(bool bvolume,bool bframe)
{
	m_pose.m_bvolume	=	bvolume;
	m_pose.m_bframe		=	bframe;
	int i,ni;

	/* Weights		*/ 
	const btScalar	omass=getTotalMass();
	const btScalar	kmass=omass*m_nodes.size()*1000;
	btScalar		tmass=omass;
	m_pose.m_wgh.resize(m_nodes.size());
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		if(m_nodes[i].m_im<=0) tmass+=kmass;
	}
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		m_pose.m_wgh[i]=	n.m_im>0					?
			1/(m_nodes[i].m_im*tmass)	:
		kmass/tmass;
	}
	/* Pos		*/ 
	const btVector3	com=evaluateCom();
	m_pose.m_pos.resize(m_nodes.size());
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		m_pose.m_pos[i]=m_nodes[i].m_x-com;
	}
	m_pose.m_volume	=	bvolume?getVolume():0;
	m_pose.m_com	=	com;
	m_pose.m_rot.setIdentity();
	m_pose.m_scl.setIdentity();
	/* Aqq		*/ 
	m_pose.m_aqq[0]	=
		m_pose.m_aqq[1]	=
		m_pose.m_aqq[2]	=	btVector3(0,0,0);
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		const btVector3&	q=m_pose.m_pos[i];
		const btVector3		mq=m_pose.m_wgh[i]*q;
		m_pose.m_aqq[0]+=mq.x()*q;
		m_pose.m_aqq[1]+=mq.y()*q;
		m_pose.m_aqq[2]+=mq.z()*q;
	}
	m_pose.m_aqq=m_pose.m_aqq.inverse();
	
	updateConstants();
}